

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

PIPELINE_STATE_STATUS __thiscall
Diligent::PipelineStateGLImpl::GetStatus(PipelineStateGLImpl *this,bool WaitForCompletion)

{
  bool bVar1;
  uint uVar2;
  PIPELINE_STATE_STATUS PVar3;
  pointer pPVar4;
  undefined8 extraout_RDX;
  bool WaitForCompletion_local;
  PipelineStateGLImpl *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_Builder);
  if (bVar1) {
    pPVar4 = std::
             unique_ptr<Diligent::PipelineStateGLImpl::PipelineBuilderBase,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
             ::operator->(&this->m_Builder);
    uVar2 = (*pPVar4->_vptr_PipelineBuilderBase[2])
                      (pPVar4,(ulong)WaitForCompletion,extraout_RDX,WaitForCompletion);
    if ((uVar2 & 1) != 0) {
      std::
      unique_ptr<Diligent::PipelineStateGLImpl::PipelineBuilderBase,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
      ::reset(&this->m_Builder,(pointer)0x0);
    }
  }
  PVar3 = std::atomic<Diligent::PIPELINE_STATE_STATUS>::load
                    (&(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_Status,
                     memory_order_seq_cst);
  return PVar3;
}

Assistant:

PIPELINE_STATE_STATUS PipelineStateGLImpl::GetStatus(bool WaitForCompletion)
{
    if (m_Builder)
    {
        if (m_Builder->Tick(WaitForCompletion))
        {
            m_Builder.reset();
        }
    }
    return m_Status.load();
}